

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

Totals * __thiscall
Catch::Totals::operator-(Totals *__return_storage_ptr__,Totals *this,Totals *other)

{
  Counts::operator-(&this->assertions,&other->assertions);
  Counts::operator-(&this->testCases,&other->testCases);
  return __return_storage_ptr__;
}

Assistant:

Totals Totals::operator - ( Totals const& other ) const {
        Totals diff;
        diff.assertions = assertions - other.assertions;
        diff.testCases = testCases - other.testCases;
        return diff;
    }